

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

void libyuv::ScalePlaneDown38_16
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint16_t *src_ptr,uint16_t *dst_ptr,FilterMode filtering)

{
  _func_void_uint16_t_ptr_ptrdiff_t_uint16_t_ptr_int *p_Var1;
  _func_void_uint16_t_ptr_ptrdiff_t_uint16_t_ptr_int *p_Var2;
  int in_ECX;
  undefined4 in_EDX;
  int in_R8D;
  int in_R9D;
  int filter_stride;
  _func_void_uint16_t_ptr_ptrdiff_t_uint16_t_ptr_int *ScaleRowDown38_2;
  _func_void_uint16_t_ptr_ptrdiff_t_uint16_t_ptr_int *ScaleRowDown38_3;
  int in_stack_00000018;
  int y;
  int local_38;
  code *local_30;
  code *local_28;
  int local_1c;
  
  local_38 = in_R8D;
  if (in_stack_00000018 == 1) {
    local_38 = 0;
  }
  if (in_stack_00000018 == 0) {
    local_28 = ScaleRowDown38_16_C;
    local_30 = ScaleRowDown38_16_C;
  }
  else {
    local_28 = ScaleRowDown38_3_Box_16_C;
    local_30 = ScaleRowDown38_2_Box_16_C;
  }
  for (local_1c = 0; local_1c < in_ECX + -2; local_1c = local_1c + 3) {
    (*local_28)(ScaleRowDown38_2,(long)local_38,ScaleRowDown38_3,in_EDX);
    p_Var1 = ScaleRowDown38_2 + (long)(in_R8D * 3) * 2;
    p_Var2 = ScaleRowDown38_3 + (long)in_R9D * 2;
    (*local_28)(p_Var1,(long)local_38,p_Var2,in_EDX);
    (*local_30)(p_Var1 + (long)(in_R8D * 3) * 2,(long)local_38,p_Var2 + (long)in_R9D * 2,in_EDX);
    ScaleRowDown38_2 = p_Var1 + (long)(in_R8D * 3) * 2 + (long)(in_R8D << 1) * 2;
    ScaleRowDown38_3 = p_Var2 + (long)in_R9D * 2 + (long)in_R9D * 2;
  }
  if (in_ECX % 3 == 2) {
    (*local_28)(ScaleRowDown38_2,(long)local_38,ScaleRowDown38_3,in_EDX);
    (*local_28)(ScaleRowDown38_2 + (long)(in_R8D * 3) * 2,0,ScaleRowDown38_3 + (long)in_R9D * 2,
                in_EDX);
  }
  else if (in_ECX % 3 == 1) {
    (*local_28)(ScaleRowDown38_2,0,ScaleRowDown38_3,in_EDX);
  }
  return;
}

Assistant:

static void ScalePlaneDown38_16(int src_width,
                                int src_height,
                                int dst_width,
                                int dst_height,
                                int src_stride,
                                int dst_stride,
                                const uint16_t* src_ptr,
                                uint16_t* dst_ptr,
                                enum FilterMode filtering) {
  int y;
  void (*ScaleRowDown38_3)(const uint16_t* src_ptr, ptrdiff_t src_stride,
                           uint16_t* dst_ptr, int dst_width);
  void (*ScaleRowDown38_2)(const uint16_t* src_ptr, ptrdiff_t src_stride,
                           uint16_t* dst_ptr, int dst_width);
  const int filter_stride = (filtering == kFilterLinear) ? 0 : src_stride;
  (void)src_width;
  (void)src_height;
  assert(dst_width % 3 == 0);
  if (!filtering) {
    ScaleRowDown38_3 = ScaleRowDown38_16_C;
    ScaleRowDown38_2 = ScaleRowDown38_16_C;
  } else {
    ScaleRowDown38_3 = ScaleRowDown38_3_Box_16_C;
    ScaleRowDown38_2 = ScaleRowDown38_2_Box_16_C;
  }
#if defined(HAS_SCALEROWDOWN38_16_NEON)
  if (TestCpuFlag(kCpuHasNEON) && (dst_width % 12 == 0)) {
    if (!filtering) {
      ScaleRowDown38_3 = ScaleRowDown38_16_NEON;
      ScaleRowDown38_2 = ScaleRowDown38_16_NEON;
    } else {
      ScaleRowDown38_3 = ScaleRowDown38_3_Box_16_NEON;
      ScaleRowDown38_2 = ScaleRowDown38_2_Box_16_NEON;
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN38_16_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && (dst_width % 24 == 0)) {
    if (!filtering) {
      ScaleRowDown38_3 = ScaleRowDown38_16_SSSE3;
      ScaleRowDown38_2 = ScaleRowDown38_16_SSSE3;
    } else {
      ScaleRowDown38_3 = ScaleRowDown38_3_Box_16_SSSE3;
      ScaleRowDown38_2 = ScaleRowDown38_2_Box_16_SSSE3;
    }
  }
#endif

  for (y = 0; y < dst_height - 2; y += 3) {
    ScaleRowDown38_3(src_ptr, filter_stride, dst_ptr, dst_width);
    src_ptr += src_stride * 3;
    dst_ptr += dst_stride;
    ScaleRowDown38_3(src_ptr, filter_stride, dst_ptr, dst_width);
    src_ptr += src_stride * 3;
    dst_ptr += dst_stride;
    ScaleRowDown38_2(src_ptr, filter_stride, dst_ptr, dst_width);
    src_ptr += src_stride * 2;
    dst_ptr += dst_stride;
  }

  // Remainder 1 or 2 rows with last row vertically unfiltered
  if ((dst_height % 3) == 2) {
    ScaleRowDown38_3(src_ptr, filter_stride, dst_ptr, dst_width);
    src_ptr += src_stride * 3;
    dst_ptr += dst_stride;
    ScaleRowDown38_3(src_ptr, 0, dst_ptr, dst_width);
  } else if ((dst_height % 3) == 1) {
    ScaleRowDown38_3(src_ptr, 0, dst_ptr, dst_width);
  }
}